

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sptk_utils.cc
# Opt level: O0

bool sptk::ReadStream<sptk::int24_t>
               (bool zero_padding,int stream_skip,int read_point,int read_size,
               vector<sptk::int24_t,_std::allocator<sptk::int24_t>_> *sequence_to_read,
               istream *input_stream,int *actual_read_size)

{
  byte bVar1;
  ulong uVar2;
  size_type sVar3;
  reference pvVar4;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  byte in_DIL;
  vector<sptk::int24_t,_std::allocator<sptk::int24_t>_> *in_R8;
  int24_t *in_R9;
  double dVar5;
  int *in_stack_00000008;
  int num_zeros;
  int gcount;
  int num_read_bytes;
  int end;
  int type_byte;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  __normal_iterator<sptk::int24_t_*,_std::vector<sptk::int24_t,_std::allocator<sptk::int24_t>_>_>
  *in_stack_ffffffffffffff78;
  size_type in_stack_ffffffffffffff88;
  vector<sptk::int24_t,_std::allocator<sptk::int24_t>_> *in_stack_ffffffffffffff90;
  int __n;
  __normal_iterator<sptk::int24_t_*,_std::vector<sptk::int24_t,_std::allocator<sptk::int24_t>_>_>
  in_stack_ffffffffffffff98;
  int24_t local_53;
  int24_t *local_50;
  int24_t *local_48;
  int24_t *local_40;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  undefined4 local_24;
  int24_t *local_20;
  vector<sptk::int24_t,_std::allocator<sptk::int24_t>_> *local_18;
  int local_10;
  int local_c;
  int local_8;
  byte local_2;
  bool local_1;
  
  local_2 = in_DIL & 1;
  if (((((in_ESI < 0) || (in_EDX < 0)) || (in_ECX < 1)) ||
      ((in_R8 == (vector<sptk::int24_t,_std::allocator<sptk::int24_t>_> *)0x0 ||
       (in_R9 == (int24_t *)0x0)))) ||
     (local_20 = in_R9, local_18 = in_R8, local_10 = in_ECX, local_c = in_EDX, local_8 = in_ESI,
     uVar2 = std::ios::eof(), (uVar2 & 1) != 0)) {
    local_1 = false;
  }
  else {
    local_24 = 3;
    if (0 < local_8) {
      std::istream::ignore((long)local_20);
      uVar2 = std::ios::eof();
      if ((uVar2 & 1) != 0) {
        return false;
      }
    }
    local_28 = local_c + local_10;
    sVar3 = std::vector<sptk::int24_t,_std::allocator<sptk::int24_t>_>::size(local_18);
    if (sVar3 < (ulong)(long)local_28) {
      std::vector<sptk::int24_t,_std::allocator<sptk::int24_t>_>::resize
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    }
    __n = (int)((ulong)in_stack_ffffffffffffff90 >> 0x20);
    local_2c = local_10 * 3;
    pvVar4 = std::vector<sptk::int24_t,_std::allocator<sptk::int24_t>_>::operator[](local_18,0);
    std::istream::read((char *)local_20,(long)(pvVar4 + local_c));
    local_30 = std::istream::gcount();
    if (in_stack_00000008 != (int *)0x0) {
      *in_stack_00000008 = local_30 / 3;
    }
    if (local_2c == local_30) {
      bVar1 = std::ios::fail();
      local_1 = (bool)((bVar1 ^ 0xff) & 1);
    }
    else if (((local_2 & 1) == 0) || (local_30 < 1)) {
      local_1 = false;
    }
    else {
      dVar5 = ceil((double)(local_2c - local_30) / 3.0);
      local_34 = (int)dVar5;
      if (local_34 < 0) {
        local_1 = false;
      }
      else {
        local_50 = (int24_t *)
                   std::vector<sptk::int24_t,_std::allocator<sptk::int24_t>_>::begin
                             ((vector<sptk::int24_t,_std::allocator<sptk::int24_t>_> *)
                              CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
        local_48 = (int24_t *)
                   __gnu_cxx::
                   __normal_iterator<sptk::int24_t_*,_std::vector<sptk::int24_t,_std::allocator<sptk::int24_t>_>_>
                   ::operator+(in_stack_ffffffffffffff78,
                               CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
        local_40 = (int24_t *)
                   __gnu_cxx::
                   __normal_iterator<sptk::int24_t_*,_std::vector<sptk::int24_t,_std::allocator<sptk::int24_t>_>_>
                   ::operator-(in_stack_ffffffffffffff78,
                               CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
        int24_t::int24_t<int>
                  ((int24_t *)CONCAT44(local_34,in_stack_ffffffffffffff70),in_stack_ffffffffffffff6c
                  );
        std::
        fill_n<__gnu_cxx::__normal_iterator<sptk::int24_t*,std::vector<sptk::int24_t,std::allocator<sptk::int24_t>>>,int,sptk::int24_t>
                  (in_stack_ffffffffffffff98,__n,local_20);
        int24_t::~int24_t(&local_53);
        bVar1 = std::ios::bad();
        local_1 = (bool)((bVar1 ^ 0xff) & 1);
      }
    }
  }
  return local_1;
}

Assistant:

bool ReadStream(bool zero_padding, int stream_skip, int read_point,
                int read_size, std::vector<T>* sequence_to_read,
                std::istream* input_stream, int* actual_read_size) {
  if (stream_skip < 0 || read_point < 0 || read_size <= 0 ||
      NULL == sequence_to_read || NULL == input_stream || input_stream->eof()) {
    return false;
  }

  const int type_byte(sizeof((*sequence_to_read)[0]));

  if (0 < stream_skip) {
    input_stream->ignore(type_byte * stream_skip);
    if (input_stream->eof()) return false;
  }

  const int end(read_point + read_size);
  if (sequence_to_read->size() < static_cast<std::size_t>(end)) {
    sequence_to_read->resize(end);
  }

  const int num_read_bytes(type_byte * read_size);
  input_stream->read(
      reinterpret_cast<char*>(&((*sequence_to_read)[0]) + read_point),
      num_read_bytes);

  const int gcount(static_cast<int>(input_stream->gcount()));
  if (NULL != actual_read_size) {
    *actual_read_size = gcount / type_byte;
  }

  if (num_read_bytes == gcount) {
    return !input_stream->fail();
  } else if (zero_padding && 0 < gcount) {
    // Use std::ceil to zero incomplete data
    // as gcount may not be a multiple of sizeof(double).
    const int num_zeros(static_cast<int>(
        std::ceil(static_cast<double>(num_read_bytes - gcount) / type_byte)));
    if (num_zeros < 0) {
      return false;  // Something wrong!
    }

    std::fill_n(sequence_to_read->begin() + end - num_zeros, num_zeros,
                static_cast<T>(0));

    return !input_stream->bad();
  }

  return false;
}